

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.h
# Opt level: O3

void __thiscall YAML::SettingChanges::clear(SettingChanges *this)

{
  pointer puVar1;
  pointer puVar2;
  SettingChangeBase *pSVar3;
  pointer *__ptr;
  pointer puVar4;
  
  restore(this);
  puVar1 = (this->m_settingChanges).
           super__Vector_base<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_settingChanges).
           super__Vector_base<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pSVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
               .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl;
      if (pSVar3 != (SettingChangeBase *)0x0) {
        (*pSVar3->_vptr_SettingChangeBase[1])();
      }
      (puVar4->_M_t).
      super___uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>.
      _M_t.
      super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
      .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
           (SettingChangeBase *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    (this->m_settingChanges).
    super__Vector_base<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void clear() YAML_CPP_NOEXCEPT {
    restore();
    m_settingChanges.clear();
  }